

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  int iVar1;
  RootPathMode RVar2;
  char *pcVar3;
  string findRootPathVar;
  string rootPathMode;
  allocator local_59;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CMAKE_FIND_ROOT_PATH_MODE_","");
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)(this->CMakePathName)._M_dataplus._M_p);
  pcVar3 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,&local_58);
  std::__cxx11::string::string((string *)local_38,pcVar3,&local_59);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
    RVar2 = RootPathModeNever;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_38);
    if (iVar1 == 0) {
      RVar2 = RootPathModeOnly;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_38);
      if (iVar1 != 0) goto LAB_003a8bfb;
      RVar2 = RootPathModeBoth;
    }
  }
  this->FindRootPathMode = RVar2;
LAB_003a8bfb:
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar = "CMAKE_FIND_ROOT_PATH_MODE_";
  findRootPathVar += this->CMakePathName;
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode=="NEVER")
    {
    this->FindRootPathMode = RootPathModeNever;
    }
  else if (rootPathMode=="ONLY")
    {
    this->FindRootPathMode = RootPathModeOnly;
    }
  else if (rootPathMode=="BOTH")
    {
    this->FindRootPathMode = RootPathModeBoth;
    }
}